

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAS.cpp
# Opt level: O3

void __thiscall Storage::Tape::CAS::CAS(CAS *this,string *file_name)

{
  pointer *ppuVar1;
  short sVar2;
  pointer pCVar3;
  iterator iVar4;
  uint16_t uVar5;
  long lVar6;
  FileHolder *in_RCX;
  undefined *__nbytes;
  int __fd;
  size_t c;
  long lVar7;
  bool bVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  vector<unsigned_char,_std::allocator<unsigned_char>_> type;
  FileHolder file;
  bool bStack_172;
  bool bStack_171;
  undefined1 auStack_170 [48];
  __ino_t local_140;
  __nlink_t local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  __dev_t local_120;
  FileHolder local_118;
  
  (this->super_Tape).pulse_.length.length = 0;
  (this->super_Tape).pulse_.length.clock_rate = 1;
  (this->super_Tape)._vptr_Tape = (_func_int **)&PTR_is_at_end_005a3318;
  auStack_170._32_8_ = &this->chunks_;
  (this->chunks_).
  super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chunks_).
  super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chunks_).
  super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->chunk_pointer_ = 0;
  this->phase_ = Header;
  this->distance_into_phase_ = 0;
  this->distance_into_bit_ = 0;
  FileHolder::FileHolder(&local_118,file_name,ReadWrite);
  do {
    lVar6 = FileHolder::tell(&local_118);
    __fd = (int)&local_118;
    FileHolder::read((FileHolder *)(auStack_170 + 0x28),__fd,(void *)0x8,(size_t)in_RCX);
    bVar8 = true;
    if (local_140 - auStack_170._40_8_ == 8) {
      if (*(long *)auStack_170._40_8_ == 0x747d13ccbadea61f) {
        FileHolder::read((FileHolder *)&local_130,__fd,(void *)0xa,(size_t)in_RCX);
        bVar8 = local_130._8_8_ - local_130._0_8_ != 10;
        if (!bVar8) {
          lVar7 = *(long *)local_130._M_allocated_capacity;
          sVar2 = *(short *)(local_130._M_allocated_capacity + 8);
          auStack_170._24_4_ = ZEXT14(sVar2 != -0x2c2d || lVar7 != -0x2c2c2c2c2c2c2c2d);
          __nbytes = &DAT_004e1ce4;
          lVar6 = lVar6 + 8;
          if (((sVar2 == -0x1516 && lVar7 == -0x1515151515151516) ||
              (sVar2 == -0x2f30 && lVar7 == -0x2f2f2f2f2f2f2f30)) || (auStack_170._24_4_ == 0)) {
            FileHolder::seek(&local_118,lVar6,0);
            bStack_171 = (this->chunks_).
                         super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
                         ._M_impl.super__Vector_impl_data._M_start !=
                         (this->chunks_).
                         super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            bStack_172 = true;
            in_RCX = (FileHolder *)auStack_170;
            FileHolder::read(in_RCX,__fd,(void *)0x10,(size_t)__nbytes);
            std::vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>::
            emplace_back<bool,bool,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>
                        *)auStack_170._32_8_,&bStack_171,&bStack_172,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RCX);
            if ((FILE *)auStack_170._0_8_ != (FILE *)0x0) {
              operator_delete((void *)auStack_170._0_8_,auStack_170._16_8_ - auStack_170._0_8_);
            }
          }
          else {
            FileHolder::seek(&local_118,lVar6,0);
            uVar5 = FileHolder::get16le(&local_118);
            FileHolder::seek(&local_118,lVar6,0);
            bStack_171 = false;
            bStack_172 = false;
            in_RCX = (FileHolder *)auStack_170;
            FileHolder::read(in_RCX,__fd,(void *)((ulong)uVar5 + 2),(size_t)__nbytes);
            std::vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>::
            emplace_back<bool,bool,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>
                        *)auStack_170._32_8_,&bStack_171,&bStack_172,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RCX);
            if ((FILE *)auStack_170._0_8_ != (FILE *)0x0) {
              operator_delete((void *)auStack_170._0_8_,auStack_170._16_8_ - auStack_170._0_8_);
            }
          }
        }
        if ((long *)local_130._M_allocated_capacity != (long *)0x0) {
          operator_delete((void *)local_130._M_allocated_capacity,local_120 - local_130._0_8_);
        }
      }
      else {
        pCVar3 = (this->chunks_).
                 super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->chunks_).
            super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
            ._M_impl.super__Vector_impl_data._M_start != pCVar3) {
          iVar4._M_current =
               pCVar3[-1].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              pCVar3[-1].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&pCVar3[-1].data,iVar4
                       ,(uchar *)auStack_170._40_8_);
          }
          else {
            *iVar4._M_current = *(uchar *)auStack_170._40_8_;
            ppuVar1 = &pCVar3[-1].data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
        }
        lVar7 = 1;
        do {
          if (*(uchar *)(auStack_170._40_8_ + lVar7) == '\x1f') {
            bVar8 = false;
            FileHolder::seek(&local_118,lVar6 + lVar7,0);
            goto LAB_0044b327;
          }
          pCVar3 = (this->chunks_).
                   super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((this->chunks_).
              super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
              ._M_impl.super__Vector_impl_data._M_start != pCVar3) {
            iVar4._M_current =
                 pCVar3[-1].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                pCVar3[-1].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)&pCVar3[-1].data,
                         iVar4,(uchar *)(auStack_170._40_8_ + lVar7));
            }
            else {
              *iVar4._M_current = *(uchar *)(auStack_170._40_8_ + lVar7);
              ppuVar1 = &pCVar3[-1].data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 8);
        bVar8 = false;
      }
    }
LAB_0044b327:
    if ((long *)auStack_170._40_8_ != (long *)0x0) {
      operator_delete((void *)auStack_170._40_8_,local_138 - auStack_170._40_8_);
    }
    if (bVar8) {
      FileHolder::~FileHolder(&local_118);
      return;
    }
  } while( true );
}

Assistant:

CAS::CAS(const std::string &file_name) {
	Storage::FileHolder file(file_name);

	enum class Mode {
		Seeking,
		ASCII,
		Binary,
		BASIC
	} parsing_mode_ = Mode::Seeking;

	while(true) {
		// Churn through the file until the next header signature is found.
		const auto header_position = file.tell();
		const auto signature = file.read(8);
		if(signature.size() != 8) break;
		if(std::memcmp(signature.data(), header_signature, 8)) {
			if(!chunks_.empty()) chunks_.back().data.push_back(signature[0]);

			// Check for other 1fs in this stream, and repeat from there if any.
			for(size_t c = 1; c < 8; ++c) {
				if(signature[c] == 0x1f) {
					file.seek(header_position + long(c), SEEK_SET);
					break;
				} else {
					// Attach any unexpected bytes to the back of the most recent chunk.
					// In effect this creates a linear search for the next explicit tone.
					if(!chunks_.empty()) {
						chunks_.back().data.push_back(signature[c]);
					}
				}
			}
			continue;
		}

		// A header has definitely been found. Require from here at least 16 further bytes,
		// being the type and a name.
		const auto type = file.read(10);
		if(type.size() != 10) break;

		const bool is_binary	= !std::memcmp(type.data(), binary_signature, type.size());
		const bool is_basic		= !std::memcmp(type.data(), basic_signature, type.size());
		const bool is_ascii		= !std::memcmp(type.data(), ascii_signature, type.size());

		switch(parsing_mode_) {
			case Mode::Seeking: {
				if(is_ascii || is_binary || is_basic) {
					file.seek(header_position + 8, SEEK_SET);
					chunks_.emplace_back(!chunks_.empty(), true, file.read(10 + 6));

					if(is_ascii)	parsing_mode_ = Mode::ASCII;
					if(is_binary)	parsing_mode_ = Mode::Binary;
					if(is_basic)	parsing_mode_ = Mode::BASIC;
				} else {
					// Raw data appears now. Grab its length and keep going.
					file.seek(header_position + 8, SEEK_SET);
					const uint16_t length = file.get16le();

					file.seek(header_position + 8, SEEK_SET);
					chunks_.emplace_back(false, false, file.read(size_t(length) + 2));
				}
			} break;

			case Mode::ASCII:
				// Keep reading ASCII in 256-byte segments until a non-ASCII chunk arrives.
				if(is_binary || is_basic || is_ascii) {
					file.seek(header_position, SEEK_SET);
					parsing_mode_ = Mode::Seeking;
				} else {
					file.seek(header_position + 8, SEEK_SET);
					chunks_.emplace_back(false, false, file.read(256));
				}
			break;

			case Mode::Binary: {
				// Get the start and end addresses in order to figure out how much data
				// is here.
				file.seek(header_position + 8, SEEK_SET);
				const uint16_t start_address = file.get16le();
				const uint16_t end_address = file.get16le();

				file.seek(header_position + 8, SEEK_SET);
				const auto length = end_address - start_address + 1;
				chunks_.emplace_back(false, false, file.read(size_t(length) + 6));

				parsing_mode_ = Mode::Seeking;
			} break;

			case Mode::BASIC: {
				// Horror of horrors, this will mean actually following the BASIC
				// linked list of line contents.
				file.seek(header_position + 8, SEEK_SET);
				uint16_t address = 0x8001;	// the BASIC start address.
				while(true) {
					const uint16_t next_line_address = file.get16le();
					if(!next_line_address || file.eof()) break;
					file.seek(next_line_address - address - 2, SEEK_CUR);
					address = next_line_address;
				}
				const auto length = (file.tell() - 1) - (header_position + 8);

				// Create the chunk and return to regular parsing.
				file.seek(header_position + 8, SEEK_SET);
				chunks_.emplace_back(false, false, file.read(size_t(length)));
				parsing_mode_ = Mode::Seeking;
			} break;
		}
	}
}